

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

void tt_cmap4_next(TT_CMap4 cmap)

{
  int iVar1;
  FT_Face pFVar2;
  long lVar3;
  FT_CharMap *ppFVar4;
  FT_Long FVar5;
  FT_Int FVar6;
  uint uVar7;
  ushort *puVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  FT_UInt FVar12;
  uint uVar13;
  char cVar14;
  
  if (cmap->cur_charcode < 0xffff) {
    pFVar2 = (cmap->cmap).cmap.charmap.face;
    lVar3 = *(long *)&pFVar2[3].num_charmaps;
    ppFVar4 = pFVar2[3].charmaps;
    uVar13 = cmap->cur_charcode + 1;
    if (uVar13 <= cmap->cur_start) {
      uVar13 = cmap->cur_start;
    }
    do {
      uVar7 = cmap->cur_end;
      if (uVar7 < uVar13) {
LAB_00250a80:
        FVar6 = tt_cmap4_set_range(cmap,cmap->cur_range + 1);
        if (FVar6 < 0) {
          cVar14 = '\x03';
        }
        else {
          uVar7 = cmap->cur_start;
          if (cmap->cur_start < uVar13) {
            uVar7 = uVar13;
          }
          cVar14 = '\0';
          uVar13 = uVar7;
        }
      }
      else {
        iVar1 = cmap->cur_delta;
        if (cmap->cur_values == (FT_Byte *)0x0) {
          FVar5 = pFVar2->num_glyphs;
          do {
            uVar11 = uVar13 + iVar1;
            FVar12 = uVar11 & 0xffff;
            uVar10 = uVar13;
            if (((((uVar11 & 0xffff) < (uint)FVar5) ||
                 (FVar12 = 0, uVar10 = -iVar1, (int)uVar11 < 0 && -1 < (int)(iVar1 + uVar7))) ||
                (cVar14 = '\x05', uVar10 = 0x10000 - iVar1,
                (int)uVar11 < 0x10000 && 0xffff < (int)(iVar1 + uVar7))) &&
               (uVar13 = uVar10, cVar14 = FVar12 != 0, (bool)cVar14)) {
              cmap->cur_charcode = uVar13;
              cmap->cur_gindex = FVar12;
            }
            if (cVar14 != '\0') goto LAB_00250a7a;
            uVar13 = uVar13 + 1;
          } while (uVar13 <= uVar7);
          goto LAB_00250a80;
        }
        puVar8 = (ushort *)(cmap->cur_values + (uVar13 - cmap->cur_start) * 2);
        cVar14 = '\x05';
        if (puVar8 <= (ushort *)(lVar3 + (long)ppFVar4)) {
          do {
            uVar9 = *puVar8 << 8 | *puVar8 >> 8;
            if ((uVar9 != 0) && (uVar10 = (uint)uVar9 + iVar1 & 0xffff, uVar10 != 0)) {
              cmap->cur_charcode = uVar13;
              cmap->cur_gindex = uVar10;
              cVar14 = '\x01';
              goto LAB_00250a75;
            }
            uVar13 = uVar13 + 1;
            puVar8 = puVar8 + 1;
          } while (uVar13 <= uVar7);
          cVar14 = '\0';
        }
LAB_00250a75:
        if (cVar14 == '\0') goto LAB_00250a80;
LAB_00250a7a:
        if (cVar14 == '\x05') goto LAB_00250a80;
      }
    } while (cVar14 == '\0');
    if (cVar14 != '\x03') {
      return;
    }
  }
  cmap->cur_charcode = 0xffffffff;
  cmap->cur_gindex = 0;
  return;
}

Assistant:

static void
  tt_cmap4_next( TT_CMap4  cmap )
  {
    TT_Face   face  = (TT_Face)cmap->cmap.cmap.charmap.face;
    FT_Byte*  limit = face->cmap_table + face->cmap_size;

    FT_UInt  charcode;


    if ( cmap->cur_charcode >= 0xFFFFUL )
      goto Fail;

    charcode = (FT_UInt)cmap->cur_charcode + 1;

    if ( charcode < cmap->cur_start )
      charcode = cmap->cur_start;

    for (;;)
    {
      FT_Byte*  values = cmap->cur_values;
      FT_UInt   end    = cmap->cur_end;
      FT_Int    delta  = cmap->cur_delta;


      if ( charcode <= end )
      {
        if ( values )
        {
          FT_Byte*  p = values + 2 * ( charcode - cmap->cur_start );


          /* if p > limit, the whole segment is invalid */
          if ( p > limit )
            goto Next_Segment;

          do
          {
            FT_UInt  gindex = FT_NEXT_USHORT( p );


            if ( gindex )
            {
              gindex = (FT_UInt)( (FT_Int)gindex + delta ) & 0xFFFFU;
              if ( gindex )
              {
                cmap->cur_charcode = charcode;
                cmap->cur_gindex   = gindex;
                return;
              }
            }
          } while ( ++charcode <= end );
        }
        else
        {
          do
          {
            FT_UInt  gindex = (FT_UInt)( (FT_Int)charcode + delta ) & 0xFFFFU;


            if ( gindex >= (FT_UInt)face->root.num_glyphs )
            {
              /* we have an invalid glyph index; if there is an overflow, */
              /* we can adjust `charcode', otherwise the whole segment is */
              /* invalid                                                  */
              gindex = 0;

              if ( (FT_Int)charcode + delta < 0 &&
                   (FT_Int)end + delta >= 0     )
                charcode = (FT_UInt)( -delta );

              else if ( (FT_Int)charcode + delta < 0x10000L &&
                        (FT_Int)end + delta >= 0x10000L     )
                charcode = (FT_UInt)( 0x10000L - delta );

              else
                goto Next_Segment;
            }

            if ( gindex )
            {
              cmap->cur_charcode = charcode;
              cmap->cur_gindex   = gindex;
              return;
            }
          } while ( ++charcode <= end );
        }
      }

    Next_Segment:
      /* we need to find another range */
      if ( tt_cmap4_set_range( cmap, cmap->cur_range + 1 ) < 0 )
        break;

      if ( charcode < cmap->cur_start )
        charcode = cmap->cur_start;
    }

  Fail:
    cmap->cur_charcode = (FT_UInt32)0xFFFFFFFFUL;
    cmap->cur_gindex   = 0;
  }